

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void cycle_value_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,int new_val)

{
  bool bVar1;
  int value;
  Am_Value *pAVar2;
  undefined7 in_register_00000011;
  Am_Object orig_command;
  
  Am_Object::Get_Object(&orig_command,(Am_Slot_Key)command_obj,0xc);
  if ((int)CONCAT71(in_register_00000011,selective) == 0) {
    pAVar2 = Am_Object::Get(command_obj,0x169,0);
    value = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(command_obj,0x16c,0);
    new_val = Am_Value::operator_cast_to_int(pAVar2);
  }
  else {
    bVar1 = Am_Object::Valid(&orig_command);
    value = 0;
    if (bVar1) {
      pAVar2 = Am_Object::Get(&orig_command,0x169,0);
      value = Am_Value::operator_cast_to_int(pAVar2);
    }
    if (!reload_data || undo) {
      pAVar2 = Am_Object::Get(command_obj,(ushort)undo + (ushort)undo * 2 + 0x169,0);
      new_val = Am_Value::operator_cast_to_int(pAVar2);
    }
  }
  Am_Object::Set(command_obj,0x16c,value,0);
  Am_Object::Set(command_obj,0x169,new_val,0);
  bVar1 = Am_Object::Valid(&orig_command);
  if (bVar1) {
    Am_Object::Set(&orig_command,0x169,new_val,0);
  }
  Am_Object::~Am_Object(&orig_command);
  return;
}

Assistant:

void
cycle_value_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                              bool reload_data = false, int new_val = 0)
{
  int cur_val;
  //going to set to new_val, with cur_val as old value for undo
  Am_Object orig_command = command_obj.Get_Object(Am_SOURCE_OF_COPY);
  if (selective) {
    if (orig_command.Valid())
      cur_val = orig_command.Get(Am_VALUE);
    else
      cur_val = 0;
    if (undo)
      new_val = command_obj.Get(Am_OLD_VALUE);
    else if (!reload_data)
      new_val = command_obj.Get(Am_VALUE);
  } else {
    cur_val = command_obj.Get(Am_VALUE);
    new_val = command_obj.Get(Am_OLD_VALUE);
  }
  command_obj.Set(Am_OLD_VALUE, cur_val);
  command_obj.Set(Am_VALUE, new_val);
  if (orig_command.Valid()) {
    orig_command.Set(Am_VALUE, new_val);
  }
}